

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall tf::Runtime::schedule(Runtime *this,Task *task)

{
  undefined1 *puVar1;
  long *in_RSI;
  atomic<unsigned_long> *j;
  Node *node;
  memory_order __b;
  Worker *local_88;
  uint in_stack_ffffffffffffff90;
  Executor *this_00;
  
  this_00 = (Executor *)*in_RSI;
  puVar1 = &this_00->field_0x80;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(undefined8 *)puVar1 = 0;
  if ((this_00->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    local_88 = (Worker *)
               &((this_00->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->field_0x60;
  }
  else {
    local_88 = (Worker *)
               &((this_00->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage)->_wsq;
  }
  LOCK();
  *(long *)local_88 = *(long *)local_88 + 1;
  UNLOCK();
  Executor::_schedule(this_00,local_88,(Node *)(ulong)in_stack_ffffffffffffff90);
  return;
}

Assistant:

inline void Runtime::schedule(Task task) {
  
  auto node = task._node;
  // need to keep the invariant: when scheduling a task, the task must have
  // zero dependency (join counter is 0)
  // or we can encounter bug when inserting a nested flow (e.g., module task)
  node->_join_counter.store(0, std::memory_order_relaxed);

  auto& j = node->_parent ? node->_parent->_join_counter :
                            node->_topology->_join_counter;
  j.fetch_add(1, std::memory_order_relaxed);
  _executor._schedule(_worker, node);
}